

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode Curl_http2_done_sending(Curl_easy *data,connectdata *conn)

{
  int *piVar1;
  HTTP *pHVar2;
  nghttp2_session *session;
  int iVar3;
  CURLcode result;
  CURLcode local_1c;
  
  local_1c = CURLE_OK;
  if (conn->handler == &Curl_handler_http2_ssl || conn->handler == &Curl_handler_http2) {
    pHVar2 = (data->req).p.http;
    session = (conn->proto).httpc.h2;
    if (pHVar2->upload_left != 0) {
      pHVar2->upload_left = 0;
      nghttp2_session_resume_data(session,pHVar2->stream_id);
      h2_process_pending_input(data,&(conn->proto).httpc,&local_1c);
    }
    iVar3 = nghttp2_session_want_write(session);
    if (iVar3 != 0) {
      iVar3 = h2_session_send(data,session);
      if (iVar3 != 0) {
        local_1c = CURLE_SEND_ERROR;
      }
      iVar3 = nghttp2_session_want_write(session);
      if (iVar3 != 0) {
        piVar1 = &(data->req).keepon;
        *(byte *)piVar1 = (byte)*piVar1 | 2;
      }
    }
  }
  return local_1c;
}

Assistant:

CURLcode Curl_http2_done_sending(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if((conn->handler == &Curl_handler_http2_ssl) ||
     (conn->handler == &Curl_handler_http2)) {
    /* make sure this is only attempted for HTTP/2 transfers */
    struct HTTP *stream = data->req.p.http;
    struct http_conn *httpc = &conn->proto.httpc;
    nghttp2_session *h2 = httpc->h2;

    if(stream->upload_left) {
      /* If the stream still thinks there's data left to upload. */

      stream->upload_left = 0; /* DONE! */

      /* resume sending here to trigger the callback to get called again so
         that it can signal EOF to nghttp2 */
      (void)nghttp2_session_resume_data(h2, stream->stream_id);
      (void)h2_process_pending_input(data, httpc, &result);
    }

    /* If nghttp2 still has pending frames unsent */
    if(nghttp2_session_want_write(h2)) {
      struct SingleRequest *k = &data->req;
      int rv;

      H2BUGF(infof(data, "HTTP/2 still wants to send data (easy %p)", data));

      /* and attempt to send the pending frames */
      rv = h2_session_send(data, h2);
      if(rv)
        result = CURLE_SEND_ERROR;

      if(nghttp2_session_want_write(h2)) {
         /* re-set KEEP_SEND to make sure we are called again */
         k->keepon |= KEEP_SEND;
      }
    }
  }
  return result;
}